

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O2

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _c;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_short uVar7;
  _func_int **pp_Var8;
  int iVar9;
  void *pvVar10;
  _func_int *p_Var11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  int i;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  
  p_Var11 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var11) == *(int *)(&this->field_0xd4 + (long)p_Var11)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar9 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar9;
    top_blob->h = iVar1;
    top_blob->d = iVar2;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar9 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar15 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar12 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var11)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var11) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var11),bottom_blob,top_blob,opt);
    }
    sVar12 = sVar12 * 4;
    break;
  case 2:
  case 4:
    sVar12 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar12 = bottom_blob->elemsize;
  }
  switch(iVar15) {
  case 1:
    Mat::create(top_blob,iVar9,sVar12,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar9,iVar1,sVar12,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar9,iVar1,_c,sVar12,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar9,iVar1,iVar2,_c,sVar12,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var8 = this->_vptr_Cast_x86;
  p_Var11 = pp_Var8[-3];
  iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var11);
  if (iVar15 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var11) == 2) {
      iVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar20 = 0;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar19 = bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar19 = 0;
      }
      for (; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        sVar12 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar10 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar16 = top_blob->data;
        for (lVar13 = 0; iVar15 != (int)lVar13; lVar13 = lVar13 + 1) {
          uVar7 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 * 4 + sVar12 * sVar5 * uVar20
                                               ));
          *(unsigned_short *)((long)pvVar16 + lVar13 * 2 + sVar4 * sVar6 * uVar20) = uVar7;
        }
      }
      pp_Var8 = this->_vptr_Cast_x86;
      p_Var11 = pp_Var8[-3];
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var11);
      goto LAB_0048cc8b;
    }
    iVar15 = 1;
LAB_0048cd93:
    pp_Var8 = pp_Var8 + -3;
  }
  else {
LAB_0048cc8b:
    if (iVar15 == 2) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var11) != 1) {
        iVar15 = 2;
        goto LAB_0048cd93;
      }
      iVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar20 = 0;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar17 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar17 = uVar20;
      }
      for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
        sVar12 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar10 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar16 = top_blob->data;
        for (lVar13 = 0; iVar15 != (int)lVar13; lVar13 = lVar13 + 1) {
          fVar21 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar10 + lVar13 * 2 + sVar12 * sVar5 * uVar20));
          *(float *)((long)pvVar16 + lVar13 * 4 + sVar4 * sVar6 * uVar20) = fVar21;
        }
      }
      pp_Var8 = this->_vptr_Cast_x86;
      p_Var11 = pp_Var8[-3];
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var11);
    }
    pp_Var8 = pp_Var8 + -3;
    if (iVar15 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var11) != 1) {
        return 0;
      }
      uVar19 = iVar2 * _elempack * iVar1 * iVar9;
      pvVar10 = bottom_blob->data;
      sVar12 = bottom_blob->cstep;
      pvVar16 = top_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      uVar17 = 0;
      uVar20 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar20 = uVar17;
      }
      uVar14 = (ulong)_c;
      if ((int)_c < 1) {
        uVar14 = uVar17;
      }
      sVar6 = bottom_blob->elemsize;
      for (; uVar17 != uVar14; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
          *(float *)((long)pvVar16 + uVar18 * 4) = (float)(int)*(char *)((long)pvVar10 + uVar18);
        }
        pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar5);
        pvVar10 = (void *)((long)pvVar10 + sVar12 * sVar6);
      }
      p_Var11 = *pp_Var8;
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var11);
    }
  }
  if (iVar15 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var11) != 4) {
      return 0;
    }
    iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    pvVar10 = bottom_blob->data;
    sVar12 = bottom_blob->elemsize;
    pvVar16 = top_blob->data;
    sVar4 = top_blob->elemsize;
    sVar5 = top_blob->cstep;
    uVar20 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    uVar17 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar17 = uVar20;
    }
    sVar6 = bottom_blob->cstep;
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      for (lVar13 = 0; iVar9 != (int)lVar13; lVar13 = lVar13 + 1) {
        *(undefined2 *)((long)pvVar16 + lVar13 * 2) =
             *(undefined2 *)((long)pvVar10 + lVar13 * 4 + 2);
      }
      pvVar10 = (void *)((long)pvVar10 + sVar12 * sVar6);
      pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar5);
    }
    p_Var11 = *pp_Var8;
    iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var11);
  }
  if ((iVar15 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var11) == 1)) {
    iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    pvVar10 = bottom_blob->data;
    sVar12 = top_blob->elemsize;
    sVar4 = top_blob->cstep;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    sVar5 = bottom_blob->elemsize;
    uVar20 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar20 = 0;
    }
    pvVar16 = top_blob->data;
    sVar6 = bottom_blob->cstep;
    for (uVar17 = 0; uVar17 != uVar20; uVar17 = uVar17 + 1) {
      for (lVar13 = 0; iVar9 != (int)lVar13; lVar13 = lVar13 + 1) {
        *(uint *)((long)pvVar16 + lVar13 * 4) =
             (uint)*(ushort *)((long)pvVar10 + lVar13 * 2) << 0x10;
      }
      pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar6);
      pvVar16 = (void *)((long)pvVar16 + sVar12 * sVar4);
    }
  }
  return 0;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}